

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

uint16_t __thiscall icu_63::Normalizer2Impl::getRawNorm16(Normalizer2Impl *this,UChar32 c)

{
  void *pvVar1;
  int local_34;
  int local_30;
  int local_2c;
  UChar32 c_local;
  Normalizer2Impl *this_local;
  
  pvVar1 = (this->normTrie->data).ptr0;
  if ((uint)c < 0x10000) {
    local_2c = (uint)this->normTrie->index[c >> 6] + (c & 0x3fU);
  }
  else {
    if ((uint)c < 0x110000) {
      if (c < this->normTrie->highStart) {
        local_30 = ucptrie_internalSmallIndex_63(this->normTrie,c);
      }
      else {
        local_30 = this->normTrie->dataLength + -2;
      }
      local_34 = local_30;
    }
    else {
      local_34 = this->normTrie->dataLength + -1;
    }
    local_2c = local_34;
  }
  return *(uint16_t *)((long)pvVar1 + (long)local_2c * 2);
}

Assistant:

uint16_t getRawNorm16(UChar32 c) const { return UCPTRIE_FAST_GET(normTrie, UCPTRIE_16, c); }